

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::AdvancedSSOAtomicCounters::Setup(AdvancedSSOAtomicCounters *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  this->m_vao = 0;
  this->m_vbo = 0;
  this->m_vsp = 0;
  this->m_fsp = 0;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_buffer);
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->m_buffer_tex);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_counter_buffer);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_transform_buffer);
  glu::CallLogWrapper::glGenProgramPipelines(this_00,1,&this->m_pipeline);
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_vao = 0;
		m_vbo = 0;
		m_vsp = 0;
		m_fsp = 0;
		glGenBuffers(1, &m_buffer);
		glGenTextures(1, &m_buffer_tex);
		glGenBuffers(1, &m_counter_buffer);
		glGenBuffers(1, &m_transform_buffer);
		glGenProgramPipelines(1, &m_pipeline);
		return NO_ERROR;
	}